

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O0

int countSelected(atom *theAtoms,int srcFlag)

{
  int local_24;
  atom_t *paStack_20;
  int ns;
  atom *a;
  int srcFlag_local;
  atom *theAtoms_local;
  
  local_24 = 0;
  for (paStack_20 = theAtoms; paStack_20 != (atom *)0x0; paStack_20 = paStack_20->next) {
    if ((paStack_20->flags & srcFlag) != 0) {
      local_24 = local_24 + 1;
    }
  }
  return local_24;
}

Assistant:

int countSelected(atom *theAtoms, int srcFlag)
{
   atom *a = NULL;
   int ns = 0;
   for(a = theAtoms; a; a = a->next) {
      if (a->flags & srcFlag) { ns++; }
   }
   return ns;
}